

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

void __thiscall
ON_Layer::SetPerViewportColor(ON_Layer *this,ON_UUID viewport_id,ON_Color layer_color)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON__LayerPerViewSettings *this_00;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_34;
  uchar *local_30;
  uchar local_28 [8];
  
  local_28 = viewport_id.Data4;
  local_30 = viewport_id._0_8_;
  local_34 = layer_color.field_0;
  bVar1 = ON_UuidIsNil((ON_UUID *)&local_30);
  if (bVar1) {
    DeletePerViewportColor(this,(ON_UUID *)&local_30);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
    uVar3 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_34);
    if (uVar2 != uVar3) {
      (this->m_color).field_0 = local_34;
    }
  }
  else {
    uVar2 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_34);
    viewport_id_00.Data4[0] = uVar2 != 0xffffffff;
    viewport_id_00._0_8_ = local_28;
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    this_00 = ON__LayerExtensions::ViewportSettings
                        ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,local_30,
                         viewport_id_00,(bool)in_R9B);
    if ((this_00 != (ON__LayerPerViewSettings *)0x0) &&
       ((this_00->m_color).field_0 = local_34, uVar2 == 0xffffffff)) {
      uVar2 = ON__LayerPerViewSettings::SettingsMask(this_00);
      if (uVar2 == 0) {
        ON__LayerExtensions::DeleteViewportSettings(this,&this->m_extension_bits,this_00);
      }
    }
  }
  return;
}

Assistant:

void ON_Layer::SetPerViewportColor( ON_UUID viewport_id, ON_Color layer_color )
{
  if ( ON_UuidIsNil(viewport_id) )
  {
    DeletePerViewportColor(viewport_id);
    if ( ON_Color::UnsetColor != layer_color )
      m_color = layer_color;
  }
  else
  {
    bool bSet = ( layer_color != ON_UNSET_COLOR );
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, bSet );
    if ( vp_settings )
    {
      vp_settings->m_color = layer_color;
      if ( !bSet && 0 == vp_settings->SettingsMask() )
        ON__LayerExtensions::DeleteViewportSettings(*this, &m_extension_bits, vp_settings);
    }
  }
}